

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

maybe<example::aln_t> * __thiscall
rangeless::fn::impl::
catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>
::operator()(maybe<example::aln_t> *__return_storage_ptr__,
            catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>
            *this)

{
  ulong uVar1;
  alns_t *paVar2;
  pointer paVar3;
  end_seq local_91;
  aln_t local_90;
  
  if (this->ended == true) {
    __return_storage_ptr__->m_empty = true;
  }
  else {
    uVar1 = (this->gen).i;
    paVar2 = (this->gen).alns;
    paVar3 = (paVar2->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar1 < (ulong)((long)(paVar2->
                              super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)paVar3 >> 7)) {
      (this->gen).i = uVar1 + 1;
      example::aln_t::aln_t(&local_90,paVar3 + uVar1);
    }
    else {
      end_seq::end_seq(&local_91);
      end_seq::operator_cast_to_aln_t(&local_90,&local_91);
    }
    maybe<example::aln_t>::maybe(__return_storage_ptr__,&local_90);
    example::aln_t::~aln_t(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator()() -> maybe<value_type>
        {
            if(ended) {
                return { };
            }

            try {
                return { gen() };
            } catch( const end_seq::exception& ) {
                ended = true;
                return { };
            }
        }